

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

llama_sampler *
llama_sampler_init_grammar_impl
          (llama_vocab *vocab,char *grammar_str,char *grammar_root,bool lazy,char **trigger_words,
          size_t num_trigger_words,llama_token *trigger_tokens,size_t num_trigger_tokens,
          char **trigger_patterns,size_t num_trigger_patterns)

{
  char *__s;
  int iVar1;
  llama_sampler_grammar *this;
  llama_sampler *plVar2;
  undefined7 in_register_00000009;
  size_t sVar3;
  allocator<char> local_c5;
  undefined4 local_c4;
  char *local_c0;
  llama_vocab *local_b8;
  char *local_b0;
  string trigger_pattern;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  llama_grammar *local_60;
  char *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b0 = grammar_root;
  this = (llama_sampler_grammar *)operator_new(0x50);
  (this->grammar_str)._M_dataplus._M_p = (pointer)&(this->grammar_str).field_2;
  (this->grammar_str)._M_string_length = 0;
  (this->grammar_str).field_2._M_local_buf[0] = '\0';
  (this->grammar_root)._M_dataplus._M_p = (pointer)&(this->grammar_root).field_2;
  (this->grammar_root)._M_string_length = 0;
  (this->grammar_root).field_2._M_local_buf[0] = '\0';
  if ((grammar_str == (char *)0x0) || (*grammar_str == '\0')) {
    trigger_pattern._M_string_length = (long)&trigger_pattern.field_2 + 8;
    trigger_pattern.field_2._M_allocated_capacity = 0;
    trigger_pattern.field_2._M_local_buf[8] = '\0';
    local_80._M_p = (pointer)&local_70;
    local_78 = 0;
    local_70._M_local_buf[0] = '\0';
    local_60 = (llama_grammar *)0x0;
    trigger_pattern._M_dataplus._M_p = (pointer)vocab;
    llama_sampler_grammar::operator=(this,(llama_sampler_grammar *)&trigger_pattern);
    llama_sampler_grammar::~llama_sampler_grammar((llama_sampler_grammar *)&trigger_pattern);
  }
  else {
    local_c4 = (undefined4)CONCAT71(in_register_00000009,lazy);
    local_c0 = grammar_str;
    local_b8 = vocab;
    if (num_trigger_words != 0 && trigger_words != (char **)0x0) {
      if ((trigger_patterns != (char **)0x0) || (num_trigger_patterns != 0)) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-sampling.cpp"
                   ,0x5fc,"GGML_ASSERT(%s) failed",
                   "trigger_patterns == nullptr && num_trigger_patterns == 0");
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&trigger_pattern,"[\\s\\S]*?(",(allocator<char> *)&local_50);
      for (sVar3 = 0; num_trigger_words != sVar3; sVar3 = sVar3 + 1) {
        if ((llama_sampler_init_grammar_impl(llama_vocab_const*,char_const*,char_const*,bool,char_const**,unsigned_long,int_const*,unsigned_long,char_const**,unsigned_long)
             ::special_chars_abi_cxx11_ == '\0') &&
           (iVar1 = __cxa_guard_acquire(&llama_sampler_init_grammar_impl(llama_vocab_const*,char_const*,char_const*,bool,char_const**,unsigned_long,int_const*,unsigned_long,char_const**,unsigned_long)
                                         ::special_chars_abi_cxx11_), iVar1 != 0)) {
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                    (&llama_sampler_init_grammar_impl(llama_vocab_const*,char_const*,char_const*,bool,char_const**,unsigned_long,int_const*,unsigned_long,char_const**,unsigned_long)
                      ::special_chars_abi_cxx11_,"[.^$|()*+?\\[\\]{}\\\\]",0x10);
          __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                       ~basic_regex,
                       &llama_sampler_init_grammar_impl(llama_vocab_const*,char_const*,char_const*,bool,char_const**,unsigned_long,int_const*,unsigned_long,char_const**,unsigned_long)
                        ::special_chars_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&llama_sampler_init_grammar_impl(llama_vocab_const*,char_const*,char_const*,bool,char_const**,unsigned_long,int_const*,unsigned_long,char_const**,unsigned_long)
                               ::special_chars_abi_cxx11_);
        }
        if (sVar3 != 0) {
          std::__cxx11::string::append((char *)&trigger_pattern);
        }
        std::regex_replace<std::__cxx11::regex_traits<char>,char>
                  (&local_50,trigger_words[sVar3],
                   &llama_sampler_init_grammar_impl(llama_vocab_const*,char_const*,char_const*,bool,char_const**,unsigned_long,int_const*,unsigned_long,char_const**,unsigned_long)
                    ::special_chars_abi_cxx11_,"\\$0",0);
        std::__cxx11::string::append((string *)&trigger_pattern);
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::__cxx11::string::append((char *)&trigger_pattern);
      std::__cxx11::string::~string((string *)&trigger_pattern);
      num_trigger_patterns = 1;
      trigger_patterns = &local_58;
    }
    __s = local_b0;
    trigger_pattern._M_dataplus._M_p = (pointer)local_b8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&trigger_pattern._M_string_length,local_c0,(allocator<char> *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,__s,&local_c5);
    local_60 = llama_grammar_init_impl
                         (local_b8,local_c0,__s,local_c4._0_1_,trigger_patterns,num_trigger_patterns
                          ,trigger_tokens,num_trigger_tokens);
    llama_sampler_grammar::operator=(this,(llama_sampler_grammar *)&trigger_pattern);
    llama_sampler_grammar::~llama_sampler_grammar((llama_sampler_grammar *)&trigger_pattern);
    if (this->grammar == (llama_grammar *)0x0) {
      llama_sampler_grammar::~llama_sampler_grammar(this);
      operator_delete(this,0x50);
      return (llama_sampler *)0x0;
    }
  }
  plVar2 = llama_sampler_init(&llama_sampler_grammar_i,this);
  return plVar2;
}

Assistant:

static struct llama_sampler * llama_sampler_init_grammar_impl(
        const struct llama_vocab * vocab,
                      const char * grammar_str,
                      const char * grammar_root,
                              bool lazy,
                     const char ** trigger_words,
                            size_t num_trigger_words,
               const llama_token * trigger_tokens,
                            size_t num_trigger_tokens,
                     const char ** trigger_patterns,
                            size_t num_trigger_patterns) {
    auto * ctx = new llama_sampler_grammar;

    if (grammar_str != nullptr && grammar_str[0] != '\0') {
        // TODO: remove trigger_words support.
        if (trigger_words != nullptr && num_trigger_words > 0) {
            GGML_ASSERT(trigger_patterns == nullptr && num_trigger_patterns == 0);
            std::string trigger_pattern("[\\s\\S]*?(");
            for (size_t i = 0; i < num_trigger_words; ++i) {
                static const std::regex special_chars("[.^$|()*+?\\[\\]{}\\\\]");
                if (i > 0) {
                    trigger_pattern += "|";
                }
                trigger_pattern += std::regex_replace(trigger_words[i], special_chars, "\\$0");
            }
            trigger_pattern += ")[\\s\\S]*";
            auto trigger_pattern_c = trigger_pattern.c_str();
            trigger_patterns = &trigger_pattern_c;
            num_trigger_patterns = 1;
        }
        *ctx = {
            /* .vocab        = */ vocab,
            /* .grammar_str  = */ grammar_str,
            /* .grammar_root = */ grammar_root,
            /* .grammar      = */ llama_grammar_init_impl(vocab, grammar_str, grammar_root, lazy, trigger_patterns, num_trigger_patterns, trigger_tokens, num_trigger_tokens),
        };
        if (!ctx->grammar) {
            delete ctx;
            return nullptr;
        }
    } else {
        *ctx = {
            /* .vocab        = */ vocab,
            /* .grammar_str  = */ {},
            /* .grammar_root = */ {},
            /* .grammar      = */ nullptr,
        };
    }

    return llama_sampler_init(
        /* .iface = */ &llama_sampler_grammar_i,
        /* .ctx   = */ ctx
    );
}